

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * GenImageGradientSquare
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  pvVar1 = malloc((long)(height * width) << 2);
  if (0 < height) {
    lVar2 = (long)pvVar1 + 3;
    uVar3 = 0;
    do {
      if (0 < width) {
        fVar5 = ABS((float)(int)uVar3 - (float)height * 0.5) / ((float)height * 0.5);
        uVar4 = 0;
        do {
          fVar6 = ABS((float)(int)uVar4 - (float)width * 0.5) / ((float)width * 0.5);
          fVar7 = fVar5;
          if (fVar5 <= fVar6) {
            fVar7 = fVar6;
          }
          fVar7 = ((float)(-(uint)NAN(fVar6) & (uint)fVar5 | ~-(uint)NAN(fVar6) & (uint)fVar7) -
                  density) / (1.0 - density);
          if (fVar7 <= 0.0) {
            fVar7 = 0.0;
          }
          if (1.0 <= fVar7) {
            fVar7 = 1.0;
          }
          fVar6 = 1.0 - fVar7;
          *(char *)(lVar2 + -3 + uVar4 * 4) =
               (char)(int)(fVar6 * (float)((uint)inner & 0xff) + fVar7 * (float)((uint)outer & 0xff)
                          );
          *(char *)(lVar2 + -2 + uVar4 * 4) =
               (char)(int)(fVar6 * (float)((uint)inner >> 8 & 0xff) +
                          fVar7 * (float)((uint)outer >> 8 & 0xff));
          *(char *)(lVar2 + -1 + uVar4 * 4) =
               (char)(int)(fVar6 * (float)((uint)inner >> 0x10 & 0xff) +
                          fVar7 * (float)((uint)outer >> 0x10 & 0xff));
          *(char *)(lVar2 + uVar4 * 4) =
               (char)(int)(fVar6 * (float)((uint)inner >> 0x18) +
                          fVar7 * (float)((uint)outer >> 0x18));
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + (ulong)(uint)width * 4;
    } while (uVar3 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientSquare(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            // Calculate the Manhattan distance from the center
            float distX = fabsf(x - centerX);
            float distY = fabsf(y - centerY);

            // Normalize the distances by the dimensions of the gradient rectangle
            float normalizedDistX = distX/centerX;
            float normalizedDistY = distY/centerY;

            // Calculate the total normalized Manhattan distance
            float manhattanDist = fmaxf(normalizedDistX, normalizedDistY);

            // Subtract the density from the manhattanDist, then divide by (1 - density)
            // This makes the gradient start from the center when density is 0, and from the edge when density is 1
            float factor = (manhattanDist - density)/(1.0f - density);

            // Clamp the factor between 0 and 1
            factor = fminf(fmaxf(factor, 0.0f), 1.0f);

            // Blend the colors based on the calculated factor
            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}